

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * __thiscall
phosg::vformat_color_escape_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,TerminalFormat color,__va_list_tag *va)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  undefined4 in_register_00000014;
  int *local_90;
  string local_58;
  allocator<char> local_22;
  undefined1 local_21;
  uint *local_20;
  __va_list_tag *va_local;
  string *psStack_10;
  TerminalFormat color_local;
  string *fmt;
  
  local_20 = (uint *)CONCAT44(in_register_00000014,color);
  va_local._4_4_ = (int)this;
  local_21 = 0;
  psStack_10 = __return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"\x1b",&local_22);
  ::std::allocator<char>::~allocator(&local_22);
  do {
    sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (__return_storage_ptr__);
    pvVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](__return_storage_ptr__,sVar2 - 1);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,(*pvVar3 == '\x1b') * ' ' + ';');
    ::std::__cxx11::to_string(&local_58,va_local._4_4_);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
    uVar1 = *local_20;
    if (uVar1 < 0x29) {
      local_90 = (int *)((long)(int)uVar1 + *(long *)(local_20 + 4));
      *local_20 = uVar1 + 8;
    }
    else {
      local_90 = *(int **)(local_20 + 2);
      *(int **)(local_20 + 2) = local_90 + 2;
    }
    va_local._4_4_ = *local_90;
  } while (va_local._4_4_ != -1);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,'m');
  return __return_storage_ptr__;
}

Assistant:

string vformat_color_escape(TerminalFormat color, va_list va) {
  string fmt("\033");

  do {
    fmt += (fmt[fmt.size() - 1] == '\033') ? '[' : ';';
    fmt += to_string((int)color);
    color = va_arg(va, TerminalFormat);
  } while (color != TerminalFormat::END);

  fmt += 'm';
  return fmt;
}